

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O1

void ELFIO::dump::symbol_table
               (ostream *out,Elf_Xword no,string *name,Elf64_Addr value,Elf_Xword size,uchar bind,
               uchar type,Elf_Half section,uint elf_class)

{
  long lVar1;
  long lVar2;
  uchar *puVar3;
  ostream oVar4;
  ostream *poVar5;
  ostream *poVar6;
  uint uVar7;
  undefined3 in_register_00000089;
  undefined1 local_85 [5];
  string local_80;
  undefined4 local_5c;
  string *local_58;
  string local_50;
  
  local_85._2_3_ = in_register_00000089;
  local_85[1] = bind;
  local_5c = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  local_58 = name;
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  lVar1 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar6 = out + lVar1;
  if (elf_class == 1) {
    if (out[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x20;
    lVar1 = *(long *)out;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffffb5 | 2;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(out + lVar1 + 0x18) = *(uint *)(out + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0x",2);
    lVar1 = *(long *)poVar5;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar6 = poVar5 + lVar1;
    if (poVar5[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar1 + 0x18) = *(uint *)(poVar5 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0x",2);
    lVar1 = *(long *)poVar5;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar6 = poVar5 + lVar1;
    if (poVar5[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar1 + 0x18) = *(uint *)(poVar5 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    lVar1 = *(long *)poVar5;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 7;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar6 = poVar5 + lVar1;
    if (poVar5[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x20;
    lVar1 = *(long *)poVar5;
    puVar3 = *(uchar **)(lVar1 + -0x18);
    *(uint *)(poVar5 + 0x18 + (long)puVar3) =
         *(uint *)(poVar5 + 0x18 + (long)puVar3) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar1 + 0x18) = *(uint *)(poVar5 + lVar1 + 0x18) & 0xffffff4f | 0x20;
    local_80._M_dataplus._M_p._0_1_ = type;
    format_assoc<ELFIO::symbol_type_t[11],unsigned_char>
              (&local_50,(dump *)symbol_type_table,(symbol_type_t (*) [11])(local_85 + 5),puVar3);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    lVar1 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar5 = poVar6 + lVar1;
    if (poVar6[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar5);
      poVar5[0xe0] = oVar4;
      poVar5[0xe1] = (ostream)0x1;
    }
    poVar5[0xe0] = (ostream)0x20;
    lVar1 = *(long *)poVar6;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    uVar7 = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x20;
    *(uint *)(poVar6 + lVar1 + 0x18) = uVar7;
    local_85[0] = (undefined1)local_85._1_4_;
    format_assoc<ELFIO::symbol_bind_t[8],unsigned_char>
              ((string *)(local_85 + 5),(dump *)symbol_bind_table,(symbol_bind_t (*) [8])local_85,
               (uchar *)(ulong)uVar7);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                                (uchar)local_80._M_dataplus._M_p),
                        local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    lVar1 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar5 = poVar6 + lVar1;
    if (poVar6[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar5);
      poVar5[0xe0] = oVar4;
      poVar5[0xe1] = (ostream)0x1;
    }
    poVar5[0xe0] = (ostream)0x20;
    lVar1 = *(long *)poVar6;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 2;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    lVar1 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 1;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar5 = poVar6 + lVar1;
    if (poVar6[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar5);
      poVar5[0xe0] = oVar4;
      poVar5[0xe1] = (ostream)0x1;
    }
    poVar5[0xe0] = (ostream)0x20;
    lVar1 = *(long *)poVar6;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x20;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(local_58->_M_dataplus)._M_p,local_58->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  else {
    if (out[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x20;
    lVar1 = *(long *)out;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffffb5 | 2;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(out + lVar1 + 0x18) = *(uint *)(out + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0x",2);
    lVar1 = *(long *)poVar5;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0x10;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar6 = poVar5 + lVar1;
    if (poVar5[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar1 + 0x18) = *(uint *)(poVar5 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0x",2);
    lVar1 = *(long *)poVar5;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 0x10;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar6 = poVar5 + lVar1;
    if (poVar5[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar1 + 0x18) = *(uint *)(poVar5 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    lVar1 = *(long *)poVar5;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 7;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar6 = poVar5 + lVar1;
    if (poVar5[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar4;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x20;
    lVar1 = *(long *)poVar5;
    puVar3 = *(uchar **)(lVar1 + -0x18);
    *(uint *)(poVar5 + 0x18 + (long)puVar3) =
         *(uint *)(poVar5 + 0x18 + (long)puVar3) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar1 + 0x18) = *(uint *)(poVar5 + lVar1 + 0x18) & 0xffffff4f | 0x20;
    local_80._M_dataplus._M_p._0_1_ = type;
    format_assoc<ELFIO::symbol_type_t[11],unsigned_char>
              (&local_50,(dump *)symbol_type_table,(symbol_type_t (*) [11])(local_85 + 5),puVar3);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    lVar1 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar5 = poVar6 + lVar1;
    if (poVar6[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar5);
      poVar5[0xe0] = oVar4;
      poVar5[0xe1] = (ostream)0x1;
    }
    poVar5[0xe0] = (ostream)0x20;
    lVar1 = *(long *)poVar6;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    uVar7 = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x20;
    *(uint *)(poVar6 + lVar1 + 0x18) = uVar7;
    local_85[0] = (undefined1)local_85._1_4_;
    format_assoc<ELFIO::symbol_bind_t[8],unsigned_char>
              ((string *)(local_85 + 5),(dump *)symbol_bind_table,(symbol_bind_t (*) [8])local_85,
               (uchar *)(ulong)uVar7);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                                (uchar)local_80._M_dataplus._M_p),
                        local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    lVar1 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar5 = poVar6 + lVar1;
    if (poVar6[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar5);
      poVar5[0xe0] = oVar4;
      poVar5[0xe1] = (ostream)0x1;
    }
    poVar5[0xe0] = (ostream)0x20;
    lVar1 = *(long *)poVar6;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 2;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        ",8);
    lVar1 = *(long *)poVar6;
    *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 1;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar5 = poVar6 + lVar1;
    if (poVar6[lVar1 + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar5);
      poVar5[0xe0] = oVar4;
      poVar5[0xe1] = (ostream)0x1;
    }
    poVar5[0xe0] = (ostream)0x20;
    lVar1 = *(long *)poVar6;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x20;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(local_58->_M_dataplus)._M_p,local_58->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_80._M_dataplus._M_p._1_7_,(uchar)local_80._M_dataplus._M_p) !=
      &local_80.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_80._M_dataplus._M_p._1_7_,(uchar)local_80._M_dataplus._M_p),
                    local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = local_5c;
  return;
}

Assistant:

static void symbol_table( std::ostream&      out,
                              Elf_Xword          no,
                              const std::string& name,
                              Elf64_Addr         value,
                              Elf_Xword          size,
                              unsigned char      bind,
                              unsigned char      type,
                              Elf_Half           section,
                              unsigned int       elf_class )
    {
        std::ios_base::fmtflags original_flags = out.flags();

        if ( elf_class == ELFCLASS32 ) { // Output for 32-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_HEX0x_FORMAT( 8 ) << value << " "
                << DUMP_HEX0x_FORMAT( 8 ) << size << " " << DUMP_STR_FORMAT( 7 )
                << str_symbol_type( type ) << " " << DUMP_STR_FORMAT( 8 )
                << str_symbol_bind( bind ) << " " << DUMP_DEC_FORMAT( 5 )
                << section << " " << DUMP_STR_FORMAT( 1 ) << name << " "
                << std::endl;
        }
        else { // Output for 64-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_HEX0x_FORMAT( 16 ) << value << " "
                << DUMP_HEX0x_FORMAT( 16 ) << size << " "
                << DUMP_STR_FORMAT( 7 ) << str_symbol_type( type ) << " "
                << DUMP_STR_FORMAT( 8 ) << str_symbol_bind( bind ) << " "
                << DUMP_DEC_FORMAT( 5 ) << section << " " << std::endl
                << "        " << DUMP_STR_FORMAT( 1 ) << name << " "
                << std::endl;
        }

        out.flags( original_flags );
    }